

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool helics::iteratingWaitingDependencyCheck(DependencyInfo *dep)

{
  TimeState TVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((dep->dependency == true) && (dep->connection != SELF)) {
    TVar1 = (dep->super_TimeData).mTimeState;
    iVar2 = (dep->super_TimeData).grantedIteration;
    if (TVar1 != initialized || iVar2 != 0) {
      return iVar2 <= (dep->super_TimeData).sequenceCounter || (byte)(TVar1 - exec_requested) < 0xfe
      ;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool iteratingWaitingDependencyCheck(const DependencyInfo& dep)
{
    if (!dep.dependency) {
        return true;
    }
    if (dep.connection == ConnectionType::SELF) {
        return true;
    }
    if (dep.mTimeState == TimeState::initialized) {
        if (dep.grantedIteration == 0) {
            return false;
        }
    }
    if (dep.mTimeState == TimeState::exec_requested_iterative ||
        dep.mTimeState == TimeState::exec_requested_require_iteration) {
        if (dep.sequenceCounter < dep.grantedIteration) {
            return false;
        }
    }
    return true;
}